

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O3

tree_node * __thiscall RegexTree::clean_block(RegexTree *this,tree_node *ptr)

{
  tree_node *ptVar1;
  
  if (ptr == (tree_node *)0x0) {
    ptVar1 = (tree_node *)0x0;
  }
  else {
    ptVar1 = clean_block(this,ptr->left);
    ptr->left = ptVar1;
    ptVar1 = clean_block(this,ptr->right);
    ptr->right = ptVar1;
    ptVar1 = ptr;
    if (ptr->c == '\x11') {
      ptVar1 = ptr->left;
      operator_delete(ptr,0x18);
    }
  }
  return ptVar1;
}

Assistant:

tree_node *RegexTree::clean_block(tree_node *ptr) {
    if (ptr == nullptr)
        return nullptr;
    ptr->left = clean_block(ptr->left);
    ptr->right = clean_block(ptr->right);

    if (ptr->c == BLOCK) {
        tree_node *ret = ptr->left;
        delete ptr;
        return ret;
    } else
        return ptr;
}